

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs2d_dpb.c
# Opt level: O2

MPP_RET avs2d_dpb_insert(Avs2dCtx_t *p_dec,HalDecTask *task)

{
  Avs2dFrame_t **ppAVar1;
  RK_U8 *pRVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  RK_U8 RVar5;
  byte bVar6;
  int iVar7;
  Avs2dPicType AVar8;
  MppFrame s;
  RK_S32 RVar9;
  int iVar10;
  uint uVar11;
  MppFrameFormat MVar12;
  MppFrameFormat MVar13;
  MPP_RET MVar14;
  RK_S64 RVar15;
  Avs2dFrame_t *pAVar16;
  int iVar17;
  ulong uVar18;
  char *fname;
  char *fmt;
  RK_U32 RVar19;
  ulong uVar20;
  uint uVar21;
  Avs2dFrame_t *pAVar22;
  uint uVar23;
  bool bVar24;
  
  if (((byte)avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_dpb","In.","avs2d_dpb_insert");
  }
  if (((p_dec->frm_mgr).output_poi != -1) &&
     ((p_dec->ph).doi != ((p_dec->frm_mgr).prev_doi + 1) % 0x100)) {
    if (((byte)avs2d_parse_debug & 4) != 0) {
      _mpp_log_l(4,"avs2d_dpb","discontinuous DOI (prev: %d --> curr: %d).",(char *)0x0);
    }
    uVar23 = (p_dec->frm_mgr).dpb_size;
    for (uVar20 = 0; uVar23 != uVar20; uVar20 = uVar20 + 1) {
      pAVar22 = (p_dec->frm_mgr).dpb[uVar20];
      if (pAVar22->slot_idx != -1) {
        uVar21 = (p_dec->ph).doi - pAVar22->doi % 0x100;
        uVar11 = -uVar21;
        if (0 < (int)uVar21) {
          uVar11 = uVar21;
        }
        if (1 < uVar11) {
          pAVar22->refered_by_others = '\0';
          pAVar22->refered_by_scene = '\0';
        }
      }
    }
  }
  iVar10 = (p_dec->ph).doi;
  iVar17 = (p_dec->frm_mgr).tr_wrap_cnt;
  if (iVar10 < (p_dec->frm_mgr).prev_doi) {
    iVar17 = iVar17 + 1;
    (p_dec->frm_mgr).tr_wrap_cnt = iVar17;
  }
  (p_dec->frm_mgr).prev_doi = iVar10;
  iVar10 = iVar10 + iVar17 * 0x100;
  (p_dec->ph).doi = iVar10;
  if (0x7ffffdfe < iVar10) {
    iVar17 = iVar17 * 0x100 + -0x100;
    uVar23 = (p_dec->frm_mgr).dpb_size;
    for (uVar20 = 0; uVar23 != uVar20; uVar20 = uVar20 + 1) {
      pAVar22 = (p_dec->frm_mgr).dpb[uVar20];
      if (pAVar22->slot_idx != -1) {
        uVar3 = pAVar22->doi;
        uVar4 = pAVar22->poi;
        pAVar22->doi = uVar3 - iVar17;
        pAVar22->poi = uVar4 - iVar17;
      }
    }
    iVar10 = iVar10 - iVar17;
    (p_dec->ph).doi = iVar10;
    iVar7 = (p_dec->frm_mgr).output_poi;
    if (iVar7 != -1) {
      (p_dec->frm_mgr).output_poi = iVar7 - iVar17;
    }
  }
  if (((byte)avs2d_parse_debug & 0x40) != 0) {
    _mpp_log_l(4,"avs2d_dpb","low_delay %d, reorder_delay %d\n","compute_frame_order_index",
               (ulong)(p_dec->vsh).low_delay,(ulong)(p_dec->vsh).picture_reorder_delay);
    iVar10 = (p_dec->ph).doi;
  }
  iVar17 = iVar10;
  if ((p_dec->vsh).low_delay == '\0') {
    iVar17 = ((uint)(p_dec->ph).picture_output_delay + iVar10) -
             (uint)(p_dec->vsh).picture_reorder_delay;
  }
  (p_dec->ph).poi = iVar17;
  if (((iVar10 < 0) || (iVar17 < 0)) &&
     (_mpp_log_l(2,"avs2d_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "ph->doi >= 0 && ph->poi >= 0","compute_frame_order_index",0xf4),
     (mpp_debug._3_1_ & 0x10) != 0)) goto LAB_0018290d;
  uVar23 = (p_dec->frm_mgr).output_poi;
  uVar20 = (ulong)uVar23;
  if (uVar23 == 0xffffffff) {
    if ((p_dec->ph).picture_type == I_PICTURE) {
      uVar23 = (p_dec->ph).poi;
      uVar20 = (ulong)uVar23;
      (p_dec->frm_mgr).output_poi = uVar23;
    }
    else {
      uVar20 = 0xffffffffffffffff;
    }
  }
  if (((byte)avs2d_parse_debug & 0x40) != 0) {
    _mpp_log_l(4,"avs2d_dpb","picuture DOI %d, POI %d, out_delay %d, output_poi %d\n",
               "compute_frame_order_index",(ulong)(uint)(p_dec->ph).doi,(ulong)(uint)(p_dec->ph).poi
               ,(ulong)(p_dec->ph).picture_output_delay,uVar20);
  }
  MVar13 = MPP_FMT_YUV420SP_10BIT;
  dpb_output_next_frame(p_dec,1);
  if (((byte)avs2d_parse_debug & 0x40) != 0) {
    _mpp_log_l(4,"avs2d_dpb","In.","dpb_remove_scene_frame");
  }
  if ((((p_dec->ph).picture_type & ~P_PICTURE) == G_PICTURE) &&
     (pAVar22 = (p_dec->frm_mgr).scene_ref, pAVar22 != (Avs2dFrame_t *)0x0)) {
    pAVar22->refered_by_scene = '\0';
    if (pAVar22->picture_type == GB_PICTURE) {
      dpb_remove_frame(p_dec,pAVar22);
    }
    (p_dec->frm_mgr).scene_ref = (Avs2dFrame_t *)0x0;
  }
  if (((byte)avs2d_parse_debug & 0x40) != 0) {
    _mpp_log_l(4,"avs2d_dpb","Out.","dpb_remove_scene_frame");
  }
  dpb_remove_unused_frame(p_dec);
  if (((byte)avs2d_parse_debug & 0x40) != 0) {
    _mpp_log_l(4,"avs2d_dpb","In.","dpb_alloc_frame");
  }
  uVar20 = (ulong)(p_dec->frm_mgr).dpb_size;
  if ((p_dec->vsh).field_coded_sequence == '\0') {
    pAVar22 = (Avs2dFrame_t *)0x0;
  }
  else {
    pAVar22 = (Avs2dFrame_t *)0x0;
    for (uVar18 = 0; uVar20 != uVar18; uVar18 = uVar18 + 1) {
      pAVar22 = (p_dec->frm_mgr).dpb[uVar18];
      if ((pAVar22->slot_idx != -1) && (pAVar22->poi == (p_dec->ph).poi)) goto LAB_00181f18;
    }
  }
  uVar18 = 0;
  do {
    if (uVar20 == uVar18) {
      if (pAVar22 == (Avs2dFrame_t *)0x0) {
        fmt = "Failed to get dpb buffer.\n";
        pAVar22 = (Avs2dFrame_t *)0x0;
        iVar17 = 2;
        fname = (char *)0x0;
        goto LAB_00182330;
      }
      break;
    }
    pAVar22 = (p_dec->frm_mgr).dpb[uVar18];
    uVar18 = uVar18 + 1;
  } while (pAVar22->slot_idx != -1);
LAB_00181f18:
  RVar9 = (p_dec->ph).poi;
  pAVar22->doi = (p_dec->ph).doi;
  pAVar22->poi = RVar9;
  pAVar22->out_delay = (uint)(p_dec->ph).picture_output_delay;
  AVar8 = (p_dec->ph).picture_type;
  MVar12 = (uint)(AVar8 == GB_PICTURE);
  if (AVar8 == G_PICTURE) {
    MVar12 = MVar13;
  }
  s = pAVar22->frame;
  pAVar22->picture_type = AVar8;
  pAVar22->invisible = AVar8 == GB_PICTURE;
  pAVar22->scene_frame_flag = (RK_U8)MVar12;
  pAVar22->intra_frame_flag = AVar8 == I_PICTURE || (AVar8 & ~P_PICTURE) == G_PICTURE;
  pAVar22->refered_by_scene = (RK_U8)MVar12;
  if (AVar8 == GB_PICTURE) {
    bVar24 = false;
  }
  else {
    bVar24 = (p_dec->frm_mgr).cur_rps.refered_by_others != '\0';
  }
  pAVar22->refered_by_others = bVar24;
  if (((byte)avs2d_parse_debug & 0x40) != 0) {
    _mpp_log_l(4,"avs2d_dpb","frame picture type %d, ref by others %d\n","dpb_alloc_frame",
               (ulong)AVar8,(ulong)bVar24);
  }
  if ((p_dec->vsh).chroma_format == '\x01') {
    RVar5 = (p_dec->vsh).bit_depth;
    if (RVar5 == '\b') {
      MVar13 = MPP_FMT_YUV420SP;
    }
    else if (RVar5 != '\n') goto LAB_00182004;
    mpp_frame_set_fmt(s,MVar13);
  }
LAB_00182004:
  MVar13 = (((p_dec->init).cfg)->base).out_fmt;
  if ((MVar13 & 0xf00000) == MPP_FMT_YUV420SP) {
    if ((MVar13 >> 0x19 & 1) != 0) {
      MVar13 = mpp_frame_get_fmt(s);
      mpp_frame_set_fmt(s,(((p_dec->init).cfg)->base).out_fmt & 0x2000000 | MVar13);
    }
  }
  else {
    RVar19 = (p_dec->vsh).horizontal_size;
    MVar13 = mpp_frame_get_fmt(s);
    mpp_frame_set_fmt(s,(((p_dec->init).cfg)->base).out_fmt & 0xf00000 | MVar13);
    if (*compat_ext_fbc_hdr_256_odd == 0) {
      RVar19 = RVar19 + 0x3f & 0xffffffc0;
    }
    else {
      RVar19 = (p_dec->vsh).horizontal_size + 0xff & 0xfffffe00 | 0x100;
    }
    mpp_frame_set_fbc_hdr_stride(s,RVar19);
    mpp_frame_set_offset_y(s,8);
  }
  if (p_dec->is_hdr != 0) {
    MVar13 = mpp_frame_get_fmt(s);
    mpp_frame_set_fmt(s,MVar13 | 0x4000000);
  }
  RVar19 = (((p_dec->init).cfg)->base).enable_thumbnail;
  if ((RVar19 == 0) || ((((p_dec->init).hw_info)->field_0x6 & 8) == 0)) {
    RVar19 = 0;
  }
  mpp_frame_set_thumbnail_en(s,RVar19);
  mpp_frame_set_width(s,(p_dec->vsh).horizontal_size);
  mpp_frame_set_height(s,(p_dec->vsh).vertical_size);
  RVar15 = mpp_packet_get_pts(task->input_packet);
  mpp_frame_set_pts(s,RVar15);
  RVar15 = mpp_packet_get_dts(task->input_packet);
  mpp_frame_set_dts(s,RVar15);
  mpp_frame_set_errinfo(s,0);
  mpp_frame_set_discard(s,0);
  mpp_frame_set_poc(s,pAVar22->poi);
  if (p_dec->got_exh != 0) {
    mpp_frame_set_color_primaries(s,(p_dec->exh).color_primaries);
    mpp_frame_set_color_trc(s,(p_dec->exh).transfer_characteristics);
    mpp_frame_set_colorspace(s,(p_dec->exh).matrix_coefficients);
  }
  mpp_frame_set_content_light(s,p_dec->content_light);
  mpp_frame_set_mastering_display(s,p_dec->display_meta);
  if ((p_dec->hdr_dynamic_meta != (MppFrameHdrDynamicMeta *)0x0) && (p_dec->hdr_dynamic != 0)) {
    mpp_frame_set_hdr_dynamic_meta(s,p_dec->hdr_dynamic_meta);
    p_dec->hdr_dynamic = 0;
  }
  if ((p_dec->vsh).progressive_sequence == '\0') {
    RVar19 = 7;
    if ((p_dec->vsh).field_coded_sequence == '\0') {
      pAVar22->frame_coding_mode = 0;
      if ((p_dec->ph).top_field_first == '\0') {
        pAVar22->frame_mode = 0xb;
        goto LAB_00182270;
      }
      pAVar22->frame_mode = 7;
    }
    else if ((p_dec->ph).top_field_first == '\0') {
      pAVar22->frame_mode = 0xb;
      pAVar22->frame_coding_mode = 0xb;
LAB_00182270:
      RVar19 = 0xb;
    }
    else {
      pAVar22->frame_mode = 7;
      pAVar22->frame_coding_mode = 7;
    }
  }
  else {
    pAVar22->frame_mode = 0;
    pAVar22->frame_coding_mode = 0;
    RVar19 = 0;
    if (((((p_dec->init).cfg)->base).enable_vproc & 2) != 0) {
      pAVar22->frame_mode = 0xc;
      RVar19 = 0xc;
    }
  }
  mpp_frame_set_mode(s,RVar19);
  MVar14 = mpp_buf_slot_get_unused(p_dec->frame_slots,&pAVar22->slot_idx);
  if ((MVar14 != MPP_OK) &&
     (_mpp_log_l(2,"avs2d_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,"ret == MPP_OK",
                 "dpb_alloc_frame",0x23b), (mpp_debug._3_1_ & 0x10) != 0)) {
LAB_0018290d:
    abort();
  }
  (p_dec->frm_mgr).used_size = (p_dec->frm_mgr).used_size + 1;
  if ((((byte)avs2d_parse_debug & 0x40) != 0) &&
     (_mpp_log_l(4,"avs2d_dpb","get unused buf slot %d, DPB used %d \n","dpb_alloc_frame",
                 (ulong)(uint)pAVar22->slot_idx), ((byte)avs2d_parse_debug & 0x40) != 0)) {
    fmt = "Out.";
    fname = "dpb_alloc_frame";
    iVar17 = 4;
LAB_00182330:
    _mpp_log_l(iVar17,"avs2d_dpb",fmt,fname);
  }
  p_dec->frame_no = p_dec->frame_no + 1;
  if (((byte)avs2d_parse_debug & 0x40) == 0) {
    if (pAVar22 == (Avs2dFrame_t *)0x0) {
      _mpp_log_l(2,"avs2d_dpb","Failed to alloc dpb frame.\n",(char *)0x0);
      MVar14 = MPP_ERR_NOMEM;
      goto LAB_001828d7;
    }
  }
  else {
    _mpp_log_l(4,"avs2d_dpb","get unused frame from dpb %d","avs2d_dpb_insert",
               (ulong)(uint)pAVar22->slot_idx);
  }
  (p_dec->frm_mgr).cur_frm = pAVar22;
  mpp_buf_slot_set_prop(p_dec->frame_slots,pAVar22->slot_idx,SLOT_FRAME,pAVar22->frame);
  mpp_buf_slot_set_flag(p_dec->frame_slots,pAVar22->slot_idx,SLOT_CODEC_USE);
  mpp_buf_slot_set_flag(p_dec->frame_slots,pAVar22->slot_idx,SLOT_HAL_OUTPUT);
  task->output = ((p_dec->frm_mgr).cur_frm)->slot_idx;
  if ((((byte)avs2d_parse_debug & 0x40) != 0) &&
     (_mpp_log_l(4,"avs2d_dpb","curframe slot_idx %d\n","avs2d_dpb_insert"),
     ((byte)avs2d_parse_debug & 0x40) != 0)) {
    _mpp_log_l(4,"avs2d_dpb","In.","dpb_set_frame_refs");
  }
  (p_dec->frm_mgr).refs[4] = (Avs2dFrame_t *)0x0;
  (p_dec->frm_mgr).refs[5] = (Avs2dFrame_t *)0x0;
  (p_dec->frm_mgr).refs[6] = (Avs2dFrame_t *)0x0;
  (p_dec->frm_mgr).refs[2] = (Avs2dFrame_t *)0x0;
  (p_dec->frm_mgr).refs[3] = (Avs2dFrame_t *)0x0;
  (p_dec->frm_mgr).refs[0] = (Avs2dFrame_t *)0x0;
  (p_dec->frm_mgr).refs[1] = (Avs2dFrame_t *)0x0;
  pAVar22 = (p_dec->frm_mgr).cur_frm;
  (p_dec->frm_mgr).num_of_ref = '\0';
  bVar6 = (p_dec->frm_mgr).cur_rps.num_of_ref;
  (task->flags).val = (task->flags).val & 0xffffffffff0000ff;
  ppAVar1 = (p_dec->frm_mgr).refs;
  for (uVar20 = 0; bVar6 != uVar20; uVar20 = uVar20 + 1) {
    uVar23 = pAVar22->doi - (uint)(p_dec->frm_mgr).cur_rps.ref_pic[uVar20];
    pAVar16 = find_ref_frame(&p_dec->frm_mgr,uVar23);
    if (pAVar16 == (Avs2dFrame_t *)0x0) {
      (task->flags).val =
           (task->flags).val & 0xffffffffff0000ff |
           (ulong)((0x100 << ((byte)uVar20 & 0x1f) | (uint)(task->flags).val) & 0xffff00);
      if (((byte)avs2d_parse_debug & 0x40) != 0) {
        _mpp_log_l(4,"avs2d_dpb","Missing ref doi %d","dpb_set_frame_refs",(ulong)uVar23);
      }
    }
    else {
      (p_dec->frm_mgr).refs[(p_dec->frm_mgr).num_of_ref] = pAVar16;
      mpp_buf_slot_set_flag(p_dec->frame_slots,pAVar16->slot_idx,SLOT_CODEC_USE);
      mpp_buf_slot_set_flag(p_dec->frame_slots,pAVar16->slot_idx,SLOT_HAL_INPUT);
    }
    pRVar2 = &(p_dec->frm_mgr).num_of_ref;
    *pRVar2 = *pRVar2 + '\x01';
  }
  bVar6 = (p_dec->frm_mgr).num_of_ref;
  if ((bVar6 == 0) && (pAVar22->intra_frame_flag == '\0')) {
LAB_00182690:
    (p_dec->syntax).refp.scene_ref_enable = 0;
    mpp_frame_set_errinfo(pAVar22->frame,1);
    MVar14 = MPP_NOK;
    if (((byte)avs2d_parse_debug & 1) == 0) {
      bVar24 = false;
    }
    else {
      bVar24 = false;
      _mpp_log_l(4,"avs2d_dpb","Error reference frame for picture(%d).\n",(char *)0x0,
                 (ulong)pAVar22->picture_type);
    }
  }
  else {
    AVar8 = pAVar22->picture_type;
    if (5 < AVar8 - P_PICTURE) goto switchD_00182584_caseD_4;
    switch(AVar8) {
    default:
      if ((p_dec->ph).background_reference_flag == '\0') {
        if (AVar8 == B_PICTURE) goto switchD_00182584_caseD_2;
        break;
      }
      pAVar22->refered_bg_frame = '\x01';
      pAVar16 = (p_dec->frm_mgr).scene_ref;
      if (pAVar16 == (Avs2dFrame_t *)0x0) goto LAB_00182690;
      iVar17 = bVar6 - 1;
LAB_001825a9:
      (p_dec->syntax).refp.scene_ref_replace_pos = iVar17;
LAB_001825af:
      (p_dec->syntax).refp.scene_ref_enable = 1;
      (p_dec->syntax).refp.scene_ref_slot_idx = pAVar16->slot_idx;
      goto LAB_0018268b;
    case B_PICTURE:
switchD_00182584_caseD_2:
      if (((bVar6 != 2) ||
          ((pAVar16 = *ppAVar1, pAVar16 != (Avs2dFrame_t *)0x0 && (pAVar16->poi <= pAVar22->poi))))
         || ((pAVar16 = (p_dec->frm_mgr).refs[1], pAVar16 != (Avs2dFrame_t *)0x0 &&
             (pAVar22->poi <= pAVar16->poi)))) goto LAB_00182690;
      break;
    case G_PICTURE:
    case GB_PICTURE:
      break;
    case S_PICTURE:
      pAVar22->refered_bg_frame = '\x01';
      pAVar16 = (p_dec->frm_mgr).scene_ref;
      if (pAVar16 == (Avs2dFrame_t *)0x0) goto LAB_00182690;
      pAVar22 = *ppAVar1;
      if (1 < bVar6 || pAVar16 != pAVar22) {
        iVar17 = 0;
        if (((byte)avs2d_parse_debug & 1) == 0) goto LAB_001825a9;
        uVar20 = 0xffffffffffffffff;
        if (pAVar22 != (Avs2dFrame_t *)0x0) {
          uVar20 = (ulong)(uint)pAVar22->doi;
        }
        _mpp_log_l(4,"avs2d_dpb","Error reference frame(doi %ld ~ %ld) for S.\n",(char *)0x0,
                   (ulong)(uint)pAVar16->doi,uVar20);
        pAVar16 = (p_dec->frm_mgr).scene_ref;
        (p_dec->syntax).refp.scene_ref_replace_pos = 0;
        if (pAVar16 != (Avs2dFrame_t *)0x0) goto LAB_001825af;
        (p_dec->syntax).refp.scene_ref_enable = 0;
        goto LAB_0018268b;
      }
    }
switchD_00182584_caseD_4:
    (p_dec->syntax).refp.scene_ref_enable = 0;
LAB_0018268b:
    MVar14 = MPP_OK;
    bVar24 = true;
  }
  if (((byte)avs2d_parse_debug & 0x40) != 0) {
    _mpp_log_l(4,"avs2d_dpb","Out. ret %d","dpb_set_frame_refs",(ulong)(uint)MVar14);
  }
  if (!bVar24) {
    *(byte *)&task->flags = *(byte *)&task->flags & 0xf7;
  }
  for (uVar20 = 0; uVar20 < (p_dec->frm_mgr).num_of_ref; uVar20 = uVar20 + 1) {
    pAVar22 = (p_dec->frm_mgr).refs[uVar20];
    if (pAVar22 == (Avs2dFrame_t *)0x0) {
      task->refer[uVar20] = -1;
      if (((byte)avs2d_parse_debug & 0x40) != 0) {
        _mpp_log_l(4,"avs2d_dpb","task refer[%d] missing ref\n","avs2d_dpb_insert",
                   uVar20 & 0xffffffff);
      }
    }
    else {
      uVar23 = pAVar22->slot_idx;
      task->refer[uVar20] = uVar23;
      if (((byte)avs2d_parse_debug & 0x40) != 0) {
        _mpp_log_l(4,"avs2d_dpb","task refer[%d] slot_idx %d doi %d poi %d","avs2d_dpb_insert",
                   uVar20 & 0xffffffff,(ulong)uVar23,(ulong)(uint)pAVar22->doi,
                   (ulong)(uint)pAVar22->poi);
      }
    }
  }
  dpb_update_refs(p_dec);
  if ((((byte)avs2d_parse_debug & 0x40) != 0) &&
     (_mpp_log_l(4,"avs2d_dpb","--------DPB INFO--------","avs2d_dpb_insert"),
     ((byte)avs2d_parse_debug & 0x40) != 0)) {
    _mpp_log_l(4,"avs2d_dpb","dpb_idx slt_idx doi poi type out refered\n","avs2d_dpb_insert");
  }
  for (uVar20 = 0; uVar20 < (p_dec->frm_mgr).dpb_size; uVar20 = uVar20 + 1) {
    if (((byte)avs2d_parse_debug & 0x40) != 0) {
      pAVar22 = (p_dec->frm_mgr).dpb[uVar20];
      AVar8 = pAVar22->picture_type;
      if ((ulong)AVar8 < 6) {
        uVar18 = (ulong)*(uint *)(&DAT_00274330 + (ulong)AVar8 * 4);
      }
      else {
        uVar18 = 0x45;
        if (AVar8 == S_PICTURE) {
          uVar18 = 0x53;
        }
      }
      _mpp_log_l(4,"avs2d_dpb","%02d      %02d      %02d  %02d  %c    %d   %d","avs2d_dpb_insert",
                 uVar20 & 0xffffffff,(ulong)(uint)pAVar22->slot_idx,(ulong)(uint)pAVar22->doi,
                 (ulong)(uint)pAVar22->poi,uVar18,(ulong)pAVar22->is_output,
                 (ulong)(pAVar22->refered_by_scene | pAVar22->refered_by_others));
    }
  }
  if (((byte)avs2d_parse_debug & 0x40) != 0) {
    _mpp_log_l(4,"avs2d_dpb","------------------------","avs2d_dpb_insert");
  }
LAB_001828d7:
  if (((byte)avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_dpb","Out.","avs2d_dpb_insert");
  }
  return MVar14;
}

Assistant:

MPP_RET avs2d_dpb_insert(Avs2dCtx_t *p_dec, HalDecTask *task)
{
    MPP_RET ret = MPP_OK;
    RK_U32 i;
    Avs2dFrame_t *p;
    Avs2dFrameMgr_t *mgr = &p_dec->frm_mgr;

    AVS2D_PARSE_TRACE("In.");

    compute_frame_order_index(p_dec);

    //!< output frame from dpb
    dpb_output_next_frame(p_dec, 1);

    //!< remove scene(G/GB) frame(scene dbp has only one G/GB)
    dpb_remove_scene_frame(p_dec);

    //!< remove unused dpb frame
    dpb_remove_unused_frame(p_dec);

    //!< set task with new frame
    p = dpb_alloc_frame(p_dec, task);
    p_dec->frame_no++;
    avs2d_dbg_dpb("get unused frame from dpb %d", p->slot_idx);
    if (!p) {
        ret = MPP_ERR_NOMEM;
        mpp_err("Failed to alloc dpb frame.\n");
        goto __FAILED;
    }

    mgr->cur_frm = p;
    mpp_buf_slot_set_prop(p_dec->frame_slots, p->slot_idx, SLOT_FRAME, p->frame);
    mpp_buf_slot_set_flag(p_dec->frame_slots, p->slot_idx, SLOT_CODEC_USE);
    mpp_buf_slot_set_flag(p_dec->frame_slots, p->slot_idx, SLOT_HAL_OUTPUT);

    //!< set task output
    task->output = mgr->cur_frm->slot_idx;
    avs2d_dbg_dpb("curframe slot_idx %d\n", mgr->cur_frm->slot_idx);

    //!< set task refers
    ret = dpb_set_frame_refs(p_dec, mgr, task);
    if (ret)
        task->flags.ref_err = 0;

    for (i = 0; i < mgr->num_of_ref; i++) {
        task->refer[i] = mgr->refs[i] ? mgr->refs[i]->slot_idx : -1;
        if (mgr->refs[i]) {
            task->refer[i] = mgr->refs[i]->slot_idx;
            avs2d_dbg_dpb("task refer[%d] slot_idx %d doi %d poi %d", i, task->refer[i], mgr->refs[i]->doi, mgr->refs[i]->poi);
        } else {
            task->refer[i] = -1;
            avs2d_dbg_dpb("task refer[%d] missing ref\n", i);
        }
    }

    //!< update dpb by rps
    dpb_update_refs(p_dec);

    avs2d_dbg_dpb("--------DPB INFO--------");
    avs2d_dbg_dpb("dpb_idx slt_idx doi poi type out refered\n");
    Avs2dFrame_t *tmp;
    for (i = 0; i < mgr->dpb_size; i++) {
        tmp = mgr->dpb[i];
        avs2d_dbg_dpb("%02d      %02d      %02d  %02d  %c    %d   %d",
                      i, tmp->slot_idx, tmp->doi, tmp->poi, PICTURE_TYPE_TO_CHAR(tmp->picture_type),
                      tmp->is_output, tmp->refered_by_others | tmp->refered_by_scene);
    }
    avs2d_dbg_dpb("------------------------");

__FAILED:
    AVS2D_PARSE_TRACE("Out.");
    return ret;
}